

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Events.c
# Opt level: O3

void character_sits(tgestate_t *state,uint8_t routeindex,route_t *route)

{
  byte bVar1;
  bool bVar2;
  
  bVar2 = (byte)(routeindex - 0x12) < 3;
  bVar1 = routeindex - 0x12;
  if (!bVar2) {
    bVar1 = routeindex - 0x15;
  }
  set_roomdef(state,bVar2 * '\x02' + '\x17',(uint)bVar1 + (uint)bVar1 * 2 + (uint)!bVar2 * 8 + 0x1d,
              5);
  character_sit_sleep_common(state,(routeindex < 0x15) * '\x02' + '\x17',route);
  return;
}

Assistant:

void character_sits(tgestate_t *state,
                    uint8_t     routeindex,
                    route_t    *route)
{
  uint8_t  index;      /* was A */
  int      room_index; /* Conv: new */
  int      offset;     /* Conv: new */
  room_t   room;       /* was C */

  assert(state  != NULL);
  assert(routeindex >= routeindex_18_PRISONER_SITS_1 &&
         routeindex <= routeindex_23_PRISONER_SITS_3);
  assert(route != NULL);
  ASSERT_ROUTE_VALID(*route);

  index = routeindex - routeindex_18_PRISONER_SITS_1;
  /* First three characters. */
  room_index = room_25_MESS_HALL;
  offset     = roomdef_25_BENCH_D;
  if (index >= 3)
  {
    /* Last two characters. */
    room_index = room_23_MESS_HALL;
    offset     = roomdef_23_BENCH_A;
    index -= 3;
  }
  set_roomdef(state,
              room_index,
              offset + index * 3,
              interiorobject_PRISONER_SAT_MID_TABLE);

  if (routeindex < routeindex_21_PRISONER_SITS_1)
    room = room_25_MESS_HALL;
  else
    room = room_23_MESS_HALL;

  character_sit_sleep_common(state, room, route);
}